

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# globals.cc
# Opt level: O1

void absl::lts_20240722::SetAndroidNativeTag(char *tag)

{
  undefined *puVar1;
  __base_type _Var2;
  size_t sVar3;
  string death_message;
  long *local_58 [2];
  long local_48 [2];
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  if (tag == (char *)0x0) {
    local_38[0] = local_28;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_38,"Check tag failed: ","");
    local_58[0] = local_48;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"tag must be non-null.","");
    std::__cxx11::string::_M_append((char *)local_38,(ulong)local_58[0]);
    if (local_58[0] != local_48) {
      operator_delete(local_58[0],local_48[0] + 1);
    }
    (*raw_log_internal::internal_log_function_abi_cxx11_)
              (3,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/log/globals.cc"
               ,0x8a,local_38);
    __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/log/globals.cc"
                  ,0x8a,"void absl::SetAndroidNativeTag(const char *)");
  }
  _Var2._M_p = (__pointer_type)operator_new(0x20);
  ((_Var2._M_p)->_M_dataplus)._M_p = (pointer)&(_Var2._M_p)->field_2;
  sVar3 = strlen(tag);
  std::__cxx11::string::_M_construct<char_const*>((string *)_Var2._M_p,tag,tag + sVar3);
  puVar1 = (anonymous_namespace)::android_log_tag;
  (anonymous_namespace)::android_log_tag = ((_Var2._M_p)->_M_dataplus)._M_p;
  LOCK();
  UNLOCK();
  if (puVar1 == "native") {
    SetAndroidNativeTag(char_const*)::user_log_tag_abi_cxx11_._M_b._M_p =
         (__base_type)(__base_type)_Var2._M_p;
    return;
  }
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_38,
             "Check android_log_tag.exchange(tag_str->c_str(), std::memory_order_acq_rel) == kDefaultAndroidTag failed: "
             ,"");
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_58,"SetAndroidNativeTag() must only be called once per process!","");
  std::__cxx11::string::_M_append((char *)local_38,(ulong)local_58[0]);
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  (*raw_log_internal::internal_log_function_abi_cxx11_)
            (3,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/log/globals.cc"
             ,0x90,local_38);
  __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/log/globals.cc"
                ,0x90,"void absl::SetAndroidNativeTag(const char *)");
}

Assistant:

void SetAndroidNativeTag(const char* tag) {
  ABSL_CONST_INIT static std::atomic<const std::string*> user_log_tag(nullptr);
  ABSL_INTERNAL_CHECK(tag, "tag must be non-null.");

  const std::string* tag_str = new std::string(tag);
  ABSL_INTERNAL_CHECK(
      android_log_tag.exchange(tag_str->c_str(), std::memory_order_acq_rel) ==
          kDefaultAndroidTag,
      "SetAndroidNativeTag() must only be called once per process!");
  user_log_tag.store(tag_str, std::memory_order_relaxed);
}